

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O2

void ff_cast(flexfloat_t *obj,flexfloat_t *source,flexfloat_desc_t desc)

{
  flexfloat_desc_t desc_00;
  double dVar1;
  byte bVar2;
  _Bool _Var3;
  ulong uVar4;
  double dVar5;
  ulong exp;
  ulong uVar6;
  uint_t uVar7;
  fp_t fVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  
  obj->value = source->value;
  (obj->desc).exp_bits = desc.exp_bits;
  (obj->desc).frac_bits = desc.frac_bits;
  if (((source->desc).exp_bits == desc.exp_bits) && (desc.frac_bits == (source->desc).frac_bits)) {
    return;
  }
  dVar1 = obj->value;
  uVar4 = flexfloat_exp(obj);
  if (((obj->desc).exp_bits == '\v') && ((obj->desc).frac_bits == '4')) {
    return;
  }
  bVar2 = (byte)((ulong)dVar1 >> 0x38);
  dVar5 = dVar1;
  exp = 0x7ff;
  if ((uVar4 != 0x7ff) && (exp = uVar4, (obj->desc).frac_bits != '4')) {
    iVar10 = fegetround();
    if (iVar10 == 0x800) {
      _Var3 = true;
LAB_00102689:
      _Var3 = flexfloat_inf_rounding(obj,uVar4,(_Bool)(bVar2 >> 7),_Var3);
LAB_0010268e:
      if (_Var3 != false) {
        dVar5 = (double)flexfloat_rounding_value(obj,uVar4,(_Bool)(bVar2 >> 7));
        obj->value = dVar5 + dVar1;
      }
    }
    else {
      if (iVar10 == 0x400) {
        _Var3 = false;
        goto LAB_00102689;
      }
      if (iVar10 == 0) {
        _Var3 = flexfloat_nearest_rounding(obj,uVar4);
        goto LAB_0010268e;
      }
    }
    exp = flexfloat_exp(obj);
    dVar5 = obj->value;
  }
  desc_00 = obj->desc;
  uVar4 = ((ulong)dVar5 & 0xfffffffffffff) >> (0x34 - desc_00.frac_bits & 0x3f);
  if (((ulong)dVar5 & 0x7ff0000000000000) == 0) {
    fVar8 = (fp_t)((uVar4 << (0x34 - desc_00.frac_bits & 0x3f)) +
                  ((ulong)dVar1 & 0x8000000000000000));
  }
  else {
    uVar11 = exp;
    if ((long)exp < 1) {
      uVar7 = flexfloat_denorm_frac(obj,exp);
      if (uVar7 == 0) {
        fVar8 = (fp_t)((ulong)dVar1 & 0x8000000000000000);
        goto LAB_0010277e;
      }
      if ((ushort)desc_00 < 0x3400) {
        iVar10 = 1 - (int)exp;
        bVar9 = (byte)iVar10;
        uVar4 = (uVar4 >> (bVar9 & 0x3f)) << (bVar9 & 0x3f);
        if (0x33 < iVar10) {
          uVar4 = 0;
        }
      }
    }
    else {
      uVar6 = ~(-1L << (desc_00.exp_bits & 0x3f));
      uVar11 = uVar6;
      if ((exp != 0x7ff) && (uVar11 = exp, (long)uVar6 <= (long)exp)) {
        uVar11 = uVar6;
        uVar4 = 0;
      }
    }
    fVar8 = (fp_t)flexfloat_pack(desc_00,(_Bool)(bVar2 >> 7),uVar11,uVar4);
  }
LAB_0010277e:
  obj->value = fVar8;
  return;
}

Assistant:

INLINE void ff_cast(flexfloat_t *obj, const flexfloat_t *source, flexfloat_desc_t desc ) {
    obj->value = source->value;
    #ifdef FLEXFLOAT_TRACKING
    obj->exact_value = source->exact_value;
    obj->tracking_fn = 0;
    obj->tracking_arg = 0;
    #endif
    obj->desc  = desc;
    if(desc.exp_bits != source->desc.exp_bits || desc.frac_bits != source->desc.frac_bits)
        flexfloat_sanitize(obj);
    #ifdef FLEXFLOAT_STATS
    if(StatsEnabled) getCastStats(source->desc, desc)->total += 1;
    #endif
}